

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

void __thiscall embree::BVHN<4>::postBuild(BVHN<4> *this,double t0)

{
  __int_type_conflict _Var1;
  pointer ppBVar2;
  BVHN<4> *pBVar3;
  bool bVar4;
  BVHNStatistics<4> *pBVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t i;
  ulong uVar8;
  size_t i_1;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  unique_ptr<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_> stat;
  double local_200;
  Lock<embree::MutexSys> lock;
  AllStatistics stat_1;
  AllStatistics local_150;
  undefined1 local_c0 [144];
  
  if (INFINITY <= t0) {
    return;
  }
  if ((this->device->super_State).benchmark == 0) {
    bVar4 = State::verbosity(&this->device->super_State,2);
    local_200 = 0.0;
    if (!bVar4) goto LAB_003f7869;
  }
  local_200 = getSeconds();
  local_200 = local_200 - t0;
LAB_003f7869:
  stat._M_t.
  super___uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::BVHNStatistics<4>_*,_std::default_delete<embree::BVHNStatistics<4>_>_>
  .super__Head_base<0UL,_embree::BVHNStatistics<4>_*,_false>._M_head_impl =
       (__uniq_ptr_data<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>,_true,_true>
        )(__uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
          )0x0;
  bVar4 = State::verbosity(&this->device->super_State,2);
  if (bVar4) {
    if ((__uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
         )stat._M_t.
          super___uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_embree::BVHNStatistics<4>_*,_std::default_delete<embree::BVHNStatistics<4>_>_>
          .super__Head_base<0UL,_embree::BVHNStatistics<4>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
         )0x0) {
      pBVar5 = (BVHNStatistics<4> *)::operator_new(0x110);
      BVHNStatistics<4>::BVHNStatistics(pBVar5,this);
      std::
      __uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>::
      reset((__uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
             *)&stat,pBVar5);
    }
    _Var1 = (this->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i;
    lock.mutex = (MutexSys *)&g_printMutex;
    lock.locked = true;
    MutexSys::lock((MutexSys *)&g_printMutex);
    poVar6 = std::operator<<((ostream *)&std::cout,"finished BVH");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,4);
    poVar6 = std::operator<<(poVar6,"<");
    pcVar7 = (char *)(**(code **)**(undefined8 **)&(this->super_AccelData).field_0x58)();
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"> : ");
    poVar6 = std::ostream::_M_insert<double>(local_200 * 1000.0);
    std::operator<<(poVar6,"ms, ");
    auVar10._0_8_ = (double)CONCAT44(0x43300000,(int)this->numPrimitives);
    auVar10._8_4_ = (int)(this->numPrimitives >> 0x20);
    auVar10._12_4_ = 0x45300000;
    poVar6 = std::ostream::_M_insert<double>
                       ((((auVar10._8_8_ - 1.9342813113834067e+25) +
                         (auVar10._0_8_ - 4503599627370496.0)) * 1e-06) / local_200);
    std::operator<<(poVar6," Mprim/s, ");
    auVar11._8_4_ = (int)(_Var1 >> 0x20);
    auVar11._0_8_ = _Var1;
    auVar11._12_4_ = 0x45300000;
    poVar6 = std::ostream::_M_insert<double>
                       ((((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)_Var1) - 4503599627370496.0)) * 1e-09) /
                        local_200);
    poVar6 = std::operator<<(poVar6," GB/s");
    std::endl<char,std::char_traits<char>>(poVar6);
    bVar4 = State::verbosity(&this->device->super_State,2);
    if (bVar4) {
      BVHNStatistics<4>::str_abi_cxx11_
                ((string *)&stat_1,
                 (BVHNStatistics<4> *)
                 stat._M_t.
                 super___uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::BVHNStatistics<4>_*,_std::default_delete<embree::BVHNStatistics<4>_>_>
                 .super__Head_base<0UL,_embree::BVHNStatistics<4>_*,_false>._M_head_impl);
      std::operator<<((ostream *)&std::cout,(string *)&stat_1);
      std::__cxx11::string::~string((string *)&stat_1);
    }
    bVar4 = State::verbosity(&this->device->super_State,2);
    if (bVar4) {
      FastAllocator::AllStatistics::AllStatistics(&stat_1,&this->alloc);
      for (uVar8 = 0;
          ppBVar2 = (this->objects).
                    super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar8 < (ulong)((long)(this->objects).
                                super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2 >> 3);
          uVar8 = uVar8 + 1) {
        pBVar3 = ppBVar2[uVar8];
        if (pBVar3 != (BVHN<4> *)0x0) {
          FastAllocator::AllStatistics::AllStatistics(&local_150,&pBVar3->alloc);
          operator+(&stat_1,&local_150);
          memcpy(&stat_1,local_c0,0x90);
        }
      }
      FastAllocator::AllStatistics::print(&stat_1,this->numPrimitives);
    }
    bVar4 = State::verbosity(&this->device->super_State,3);
    if (bVar4) {
      FastAllocator::print_blocks(&this->alloc);
      for (uVar8 = 0;
          ppBVar2 = (this->objects).
                    super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar8 < (ulong)((long)(this->objects).
                                super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2 >> 3);
          uVar8 = uVar8 + 1) {
        pBVar3 = ppBVar2[uVar8];
        if (pBVar3 != (BVHN<4> *)0x0) {
          FastAllocator::print_blocks(&pBVar3->alloc);
        }
      }
    }
    std::ostream::flush();
    Lock<embree::MutexSys>::~Lock(&lock);
  }
  if ((this->device->super_State).benchmark != 0) {
    if ((__uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
         )stat._M_t.
          super___uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_embree::BVHNStatistics<4>_*,_std::default_delete<embree::BVHNStatistics<4>_>_>
          .super__Head_base<0UL,_embree::BVHNStatistics<4>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
         )0x0) {
      pBVar5 = (BVHNStatistics<4> *)::operator_new(0x110);
      BVHNStatistics<4>::BVHNStatistics(pBVar5,this);
      std::
      __uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>::
      reset((__uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
             *)&stat,pBVar5);
    }
    stat_1.bytesUsed = (size_t)&g_printMutex;
    stat_1.bytesFree._0_1_ = 1;
    MutexSys::lock((MutexSys *)&g_printMutex);
    std::operator<<((ostream *)&std::cout,"BENCHMARK_BUILD ");
    poVar6 = std::ostream::_M_insert<double>(local_200);
    std::operator<<(poVar6," ");
    auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)this->numPrimitives);
    auVar12._8_4_ = (int)(this->numPrimitives >> 0x20);
    auVar12._12_4_ = 0x45300000;
    poVar6 = std::ostream::_M_insert<double>
                       (((auVar12._8_8_ - 1.9342813113834067e+25) +
                        (auVar12._0_8_ - 4503599627370496.0)) / local_200);
    std::operator<<(poVar6," ");
    dVar9 = BVHNStatistics<4>::sah
                      ((BVHNStatistics<4> *)
                       stat._M_t.
                       super___uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::BVHNStatistics<4>_*,_std::default_delete<embree::BVHNStatistics<4>_>_>
                       .super__Head_base<0UL,_embree::BVHNStatistics<4>_*,_false>._M_head_impl);
    poVar6 = std::ostream::_M_insert<double>(dVar9);
    poVar6 = std::operator<<(poVar6," ");
    BVHNStatistics<4>::bytesUsed
              ((BVHNStatistics<4> *)
               stat._M_t.
               super___uniq_ptr_impl<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::BVHNStatistics<4>_*,_std::default_delete<embree::BVHNStatistics<4>_>_>
               .super__Head_base<0UL,_embree::BVHNStatistics<4>_*,_false>._M_head_impl);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," BVH");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,4);
    poVar6 = std::operator<<(poVar6,"<");
    pcVar7 = (char *)(**(code **)**(undefined8 **)&(this->super_AccelData).field_0x58)();
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,">");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&stat_1);
  }
  std::unique_ptr<embree::BVHNStatistics<4>,_std::default_delete<embree::BVHNStatistics<4>_>_>::
  ~unique_ptr(&stat);
  return;
}

Assistant:

void BVHN<N>::postBuild(double t0)
  {
    if (t0 == double(inf))
      return;
    
    double dt = 0.0;
    if (device->benchmark || device->verbosity(2)) 
      dt = getSeconds()-t0;

    std::unique_ptr<BVHNStatistics<N>> stat;

    /* print statistics */
    if (device->verbosity(2))
    {
      if (!stat) stat.reset(new BVHNStatistics<N>(this));
      const size_t usedBytes = alloc.getUsedBytes();
      Lock<MutexSys> lock(g_printMutex);
      std::cout << "finished BVH" << N << "<" << primTy->name() << "> : " << 1000.0f*dt << "ms, " << 1E-6*double(numPrimitives)/dt << " Mprim/s, " << 1E-9*double(usedBytes)/dt << " GB/s" << std::endl;
    
      if (device->verbosity(2))
        std::cout << stat->str();

      if (device->verbosity(2))
      {
        FastAllocator::AllStatistics stat(&alloc);
        for (size_t i=0; i<objects.size(); i++)
          if (objects[i])
            stat = stat + FastAllocator::AllStatistics(&objects[i]->alloc);

        stat.print(numPrimitives);
      }

      if (device->verbosity(3))
      {
        alloc.print_blocks();
        for (size_t i=0; i<objects.size(); i++)
          if (objects[i]) 
            objects[i]->alloc.print_blocks();
      }

      std::cout << std::flush;
    }

    /* benchmark mode */
    if (device->benchmark)
    {
      if (!stat) stat.reset(new BVHNStatistics<N>(this));
      Lock<MutexSys> lock(g_printMutex);
      std::cout << "BENCHMARK_BUILD " << dt << " " << double(numPrimitives)/dt << " " << stat->sah() << " " << stat->bytesUsed() << " BVH" << N << "<" << primTy->name() << ">" << std::endl << std::flush;
    }
  }